

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parseExpr(Parser *this)

{
  TokenType TVar1;
  Parser *in_RSI;
  
  TVar1 = (in_RSI->m_current).type;
  if ((int)TVar1 < 0x34) {
    if ((TVar1 == LEFT_BRACE) || (TVar1 == EQUAL_GREATER)) {
      advance(in_RSI);
      parseBlockExpr(this);
      return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
             (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
    }
    if (TVar1 == FOR) {
      advance(in_RSI);
      parseForExpr(this);
      return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
             (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
    }
  }
  else {
    if (TVar1 == IF) {
      advance(in_RSI);
      parseIfExpr(this);
      return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
             (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
    }
    if (TVar1 == SWITCH) {
      advance(in_RSI);
      parseSwitchExpr(this);
      return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
             (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
    }
    if (TVar1 == WHILE) {
      advance(in_RSI);
      parseWhileExpr(this);
      return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
             (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
    }
  }
  parsePrecAssignment(this);
  return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
         (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseExpr() {
        // Expression with block?
        if (consume(TokenType::LEFT_BRACE) ||
            consume(TokenType::EQUAL_GREATER)) return parseBlockExpr();
        if (consume(TokenType::IF))            return parseIfExpr();
        if (consume(TokenType::WHILE))         return parseWhileExpr();
        if (consume(TokenType::FOR))           return parseForExpr();
        if (consume(TokenType::SWITCH))        return parseSwitchExpr();

        // Expression without block. Start at the lowest precedence.
        return parsePrecAssignment();
    }